

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O0

void __thiscall
QProcessEnvironmentPrivate::QProcessEnvironmentPrivate
          (QProcessEnvironmentPrivate *this,QProcessEnvironmentPrivate *other)

{
  long lVar1;
  long in_RDI;
  QHash<QString,_QByteArray> *other_00;
  QHash<QString,_QByteArray> *this_00;
  QHash<QString,_QByteArray> *this_01;
  long in_FS_OFFSET;
  NameMapMutexLocker locker;
  QProcessEnvironmentPrivate *in_stack_ffffffffffffff98;
  NameMapMutexLocker *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedData::QSharedData((QSharedData *)0x79751f);
  other_00 = (QHash<QString,_QByteArray> *)(in_RDI + 8);
  QMap<QByteArray,_QProcEnvValue>::QMap
            ((QMap<QByteArray,_QProcEnvValue> *)in_stack_ffffffffffffffa0,
             (QMap<QByteArray,_QProcEnvValue> *)in_stack_ffffffffffffff98);
  this_00 = (QHash<QString,_QByteArray> *)(in_RDI + 0x10);
  QHash<QString,_QByteArray>::QHash(this_00);
  QMutex::QMutex((QMutex *)0x797561);
  NameMapMutexLocker::NameMapMutexLocker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_01 = (QHash<QString,_QByteArray> *)(in_RDI + 0x10);
  QHash<QString,_QByteArray>::operator=(this_00,other_00);
  QHash<QString,_QByteArray>::detach(this_01);
  NameMapMutexLocker::~NameMapMutexLocker((NameMapMutexLocker *)0x7975b2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QProcessEnvironmentPrivate(const QProcessEnvironmentPrivate &other) :
        QSharedData(), vars(other.vars)
    {
        // We don't need to lock our own mutex, as this object is new and
        // consequently not shared. For the same reason, non-const methods
        // do not need a lock, as they detach objects (however, we need to
        // ensure that they really detach before using prepareName()).
        NameMapMutexLocker locker(&other);
        nameMap = other.nameMap;
        // We need to detach our nameMap, so that our mutex can protect it.
        // As we are being detached, it likely would be detached a moment later anyway.
        nameMap.detach();
    }